

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall higan::Socket::Bind(Socket *this)

{
  int iVar1;
  Logger local_370;
  Fmt local_158;
  undefined1 auStack_58 [8];
  sockaddr addr;
  string local_40;
  
  auStack_58._0_2_ = 0;
  auStack_58[2] = '\0';
  auStack_58[3] = '\0';
  auStack_58[4] = '\0';
  auStack_58[5] = '\0';
  auStack_58[6] = '\0';
  auStack_58[7] = '\0';
  addr.sa_family = 0;
  addr.sa_data[0] = '\0';
  addr.sa_data[1] = '\0';
  addr.sa_data[2] = '\0';
  addr.sa_data[3] = '\0';
  addr.sa_data[4] = '\0';
  addr.sa_data[5] = '\0';
  InetAddress::GetSockaddr(&this->address_,(sockaddr *)auStack_58);
  iVar1 = bind(this->fd_,(sockaddr *)auStack_58,0x10);
  if (iVar1 == -1) {
    Logger::Logger(&local_370,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/Socket.cpp"
                   ,0x29,"Bind");
    InetAddress::GetIpPort_abi_cxx11_(&local_40,&this->address_);
    Fmt::Fmt(&local_158,"bind on %s error",local_40._M_dataplus._M_p);
    Logger::operator<<(&local_370,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    Logger::~Logger(&local_370);
  }
  return;
}

Assistant:

void Socket::Bind()
{
	struct sockaddr addr{};
	address_.GetSockaddr(&addr);
	int result = bind(fd_, &addr, static_cast<socklen_t>(sizeof addr));

	if (result == -1)
	{
		LOG_FATAL << higan::Fmt("bind on %s error", address_.GetIpPort().c_str());
	}
}